

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O3

float trng::math::detail::mln1p<float>(float x)

{
  int n;
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  if (0.03125 <= ABS(x)) {
    fVar4 = log1pf(x);
    return x - fVar4;
  }
  fVar2 = 0.0;
  fVar3 = 1.0;
  iVar1 = 2;
  fVar4 = x;
  do {
    fVar4 = fVar4 * x;
    fVar5 = (fVar3 * fVar4) / (float)iVar1;
    fVar2 = fVar2 + fVar5;
    if (ABS(fVar5) < fVar2 * 4.7683716e-07) {
      return fVar2;
    }
    fVar3 = -fVar3;
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x18);
  return fVar2;
}

Assistant:

TRNG_CUDA_ENABLE T mln1p(T x) {
        if (abs(x) >= T(1) / T(32))
          return x - ln1p(x);
        // use Taylor expansion for small arguments
        T y{0};
        T x_to_the_n{x * x};
        T sign{1};
        for (int n{2}; n < numeric_limits<T>::digits; ++n) {
          const T delta{sign * x_to_the_n / n};
          y += delta;
          if (abs(delta) < 4 * numeric_limits<T>::epsilon() * y)
            break;
          x_to_the_n *= x;
          sign = -sign;
        }
        return y;
      }